

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCase::iterate
          (ComputeShaderGeneratedCase *this)

{
  pointer pVVar1;
  TextureFormat *pTVar2;
  bool bVar3;
  bool bVar4;
  RenderContext *context;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  BitDesc *pBVar8;
  TextureFormat TVar9;
  int iVar10;
  int iVar11;
  deUint32 dVar12;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  RenderTarget *pRVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar17;
  int *piVar18;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar19;
  int iVar20;
  int *piVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  char *pcVar25;
  uint uVar26;
  int iVar27;
  Bitfield<16UL> *pBVar28;
  int iVar29;
  int *piVar30;
  ulong uVar31;
  int *piVar32;
  char *pcVar33;
  bool bVar34;
  undefined4 in_XMM3_Db;
  qpTestLog *pqVar35;
  float fVar36;
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  float fVar43;
  deUint32 vaoID;
  Surface surface;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_2;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> buffer;
  undefined4 local_23c;
  int *local_238;
  ulong local_230;
  long local_228;
  Surface local_220;
  Bitfield<16UL> local_208;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  BitDesc *local_1d8;
  ulong local_1c0;
  long local_1b8;
  undefined1 local_1b0 [8];
  int local_1a8;
  pointer local_1a0;
  ios_base local_138 [264];
  undefined1 auVar38 [16];
  
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar11 = pRVar16->m_width;
  if (0x3ff < iVar11) {
    iVar11 = 0x400;
  }
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar13 = 0x400;
  if (pRVar16->m_height < 0x400) {
    iVar13 = pRVar16->m_height;
  }
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b8 = CONCAT44(extraout_var,iVar10);
  tcu::Surface::Surface(&local_220,iVar11,iVar13);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Preparing to draw ",0x12);
  std::ostream::operator<<((ostringstream *)&local_1a8,this->m_gridSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," x ",3);
  std::ostream::operator<<((ostringstream *)&local_1a8,this->m_gridSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," grid.",6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if (this->m_computeCmd == false) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Uploading draw command buffer.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar22 = CONCAT44(extraout_var_00,iVar11);
    iVar11 = this->m_numDrawCmds;
    iVar13 = (this->m_gridSize * this->m_gridSize * 2) / iVar11;
    if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
      piVar32 = (int *)0x0;
      if (iVar11 < 1) {
        piVar21 = (int *)0x0;
        piVar18 = (int *)0x0;
      }
      else {
        iVar13 = iVar13 * 3;
        iVar11 = 0;
        piVar21 = (int *)0x0;
        piVar30 = piVar32;
        piVar32 = (int *)0x0;
        piVar18 = (int *)0x0;
        local_228 = lVar22;
        do {
          iVar10 = (int)piVar30;
          if (piVar32 == piVar21) {
            uVar31 = (long)piVar32 - (long)piVar18;
            local_238 = piVar18;
            if (uVar31 == 0x7ffffffffffffff0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar23 = (long)uVar31 >> 4;
            uVar17 = 1;
            if (piVar32 != piVar18) {
              uVar17 = uVar23;
            }
            uVar19 = uVar17 + uVar23;
            if (0x7fffffffffffffe < uVar19) {
              uVar19 = 0x7ffffffffffffff;
            }
            local_230 = 0x7ffffffffffffff;
            if (!CARRY8(uVar17,uVar23)) {
              local_230 = uVar19;
            }
            if (local_230 == 0) {
              piVar18 = (int *)0x0;
            }
            else {
              piVar18 = (int *)operator_new(local_230 << 4);
            }
            piVar32 = local_238;
            piVar18[uVar23 * 4] = iVar13;
            piVar18[uVar23 * 4 + 1] = 1;
            piVar18[uVar23 * 4 + 2] = iVar10;
            piVar18[uVar23 * 4 + 3] = 0;
            if (0 < (long)uVar31) {
              memmove(piVar18,local_238,uVar31);
            }
            if (piVar32 != (int *)0x0) {
              operator_delete(piVar32,uVar31);
            }
            piVar32 = (int *)(uVar31 + (long)piVar18);
            piVar21 = piVar18 + local_230 * 4;
          }
          else {
            *piVar32 = iVar13;
            piVar32[1] = 1;
            piVar32[2] = iVar10;
            piVar32[3] = 0;
          }
          piVar32 = piVar32 + 4;
          iVar11 = iVar11 + 1;
          piVar30 = (int *)(ulong)(uint)(iVar10 + iVar13);
          lVar22 = local_228;
        } while (iVar11 < this->m_numDrawCmds);
      }
      (**(code **)(lVar22 + 0x40))(0x8f3f,this->m_cmdBufferID);
      (**(code **)(lVar22 + 0x150))(0x8f3f,(long)piVar32 - (long)piVar18,piVar18,0x88e4);
LAB_013be8c4:
      if (piVar18 != (int *)0x0) {
        operator_delete(piVar18,(long)piVar21 - (long)piVar18);
      }
    }
    else if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
      iVar10 = 0;
      if (iVar11 < 1) {
        piVar32 = (int *)0x0;
        piVar21 = (int *)0x0;
        piVar18 = (int *)0x0;
      }
      else {
        iVar13 = iVar13 * 3;
        local_1c0 = 0x7ffffffffffffff8;
        iVar11 = 0;
        piVar32 = (int *)0x0;
        piVar21 = (int *)0x0;
        piVar18 = (int *)0x0;
        local_228 = lVar22;
        do {
          if (piVar32 == piVar21) {
            uVar31 = (long)piVar32 - (long)piVar18;
            local_238 = piVar18;
            if (uVar31 == local_1c0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar22 = (long)uVar31 >> 2;
            uVar23 = lVar22 * -0x3333333333333333;
            uVar17 = uVar23;
            if (piVar32 == piVar18) {
              uVar17 = 1;
            }
            uVar19 = uVar17 + uVar23;
            if (0x666666666666665 < uVar19) {
              uVar19 = 0x666666666666666;
            }
            local_230 = 0x666666666666666;
            if (!CARRY8(uVar17,uVar23)) {
              local_230 = uVar19;
            }
            if (local_230 == 0) {
              piVar18 = (int *)0x0;
            }
            else {
              piVar18 = (int *)operator_new(local_230 * 0x14);
            }
            piVar32 = local_238;
            piVar18[lVar22] = iVar13;
            piVar18[lVar22 + 1] = 1;
            piVar18[lVar22 + 2] = iVar10;
            (piVar18 + lVar22 + 3)[0] = 0;
            (piVar18 + lVar22 + 3)[1] = 0;
            if (0 < (long)uVar31) {
              memmove(piVar18,local_238,uVar31);
            }
            if (piVar32 != (int *)0x0) {
              operator_delete(piVar32,uVar31);
            }
            piVar32 = (int *)(uVar31 + (long)piVar18);
            piVar21 = piVar18 + local_230 * 5;
          }
          else {
            *piVar32 = iVar13;
            piVar32[1] = 1;
            piVar32[2] = iVar10;
            piVar32[3] = 0;
            piVar32[4] = 0;
          }
          piVar32 = piVar32 + 5;
          iVar11 = iVar11 + 1;
          iVar10 = iVar10 + iVar13;
          lVar22 = local_228;
        } while (iVar11 < this->m_numDrawCmds);
      }
      (**(code **)(lVar22 + 0x40))(0x8f3f,this->m_cmdBufferID);
      (**(code **)(lVar22 + 0x150))(0x8f3f,(long)piVar32 - (long)piVar18,piVar18,0x88e4);
      goto LAB_013be8c4;
    }
    dVar12 = (**(code **)(lVar22 + 0x800))();
    glu::checkError(dVar12,"create draw command",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x572);
  }
  if (this->m_computeData != false) goto LAB_013beeac;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Uploading draw data buffer.",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1e8._0_4_ = 0x3f800000;
  local_1e8._4_4_ = 0x3f800000;
  uStack_1e0 = (BitDesc *)0x3f80000000000000;
  local_208.m_value._0_4_ = R;
  local_208.m_value._4_4_ = 0x3f800000;
  local_208.m_begin._0_4_ = R;
  local_208.m_begin._4_4_ = 0x3f800000;
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar22 = CONCAT44(extraout_var_01,iVar11);
  if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    iVar11 = this->m_gridSize + 1;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b0,
               (long)(iVar11 * iVar11 * 4),(allocator_type *)&local_23c);
    uVar26 = this->m_gridSize;
    if (uVar26 < 0x7fffffff) {
      iVar11 = 0;
      iVar13 = 0;
      do {
        iVar10 = uVar26 + 1;
        if (uVar26 < 0x7fffffff) {
          iVar24 = 0;
          iVar20 = 3;
          do {
            auVar39._0_4_ = (float)iVar24;
            auVar40._0_4_ = (float)(int)uVar26;
            auVar39._4_4_ = (float)iVar13;
            auVar39._8_8_ = 0;
            auVar40._4_4_ = auVar40._0_4_;
            auVar40._8_4_ = auVar40._0_4_;
            auVar40._12_4_ = auVar40._0_4_;
            auVar39 = divps(auVar39,auVar40);
            pqVar35 = (qpTestLog *)
                      CONCAT44(auVar39._4_4_ + auVar39._4_4_ + -1.0,
                               auVar39._0_4_ + auVar39._0_4_ + -1.0);
            *(qpTestLog **)
             ((pointer)((long)local_1b0 + (long)((iVar10 * iVar13 + iVar24) * 4) * 0x10))->m_data =
                 pqVar35;
            *(undefined8 *)
             ((long)((pointer)((long)local_1b0 + (long)((iVar10 * iVar13 + iVar24) * 4) * 0x10))->
                    m_data + 8) = 0x3f80000000000000;
            TVar9.type = local_208.m_begin._4_4_;
            TVar9.order = (ChannelOrder)local_208.m_begin;
            pTVar2 = (TextureFormat *)
                     ((long)local_1b0 + (long)((this->m_gridSize + 1) * iVar11 + iVar20 + -2) * 0x10
                     );
            pTVar2->order = (undefined4)local_208.m_value;
            pTVar2->type = local_208.m_value._4_4_;
            pTVar2[1] = TVar9;
            iVar10 = this->m_gridSize;
            *(qpTestLog **)
             ((pointer)((long)local_1b0 + (long)((iVar10 + 1) * iVar11 + iVar20 + -1) * 0x10))->
             m_data = pqVar35;
            *(undefined8 *)
             ((long)((pointer)((long)local_1b0 + (long)((iVar10 + 1) * iVar11 + iVar20 + -1) * 0x10)
                    )->m_data + 8) = 0x3f80000000000000;
            pVVar1 = (pointer)((long)local_1b0 +
                              (long)((this->m_gridSize + 1) * iVar11 + iVar20) * 0x10);
            pVVar1->m_data[0] = (float)local_1e8._0_4_;
            *(undefined4 *)((long)pVVar1->m_data + 4) = local_1e8._4_4_;
            *(int *)((long)pVVar1->m_data + 8) = (int)uStack_1e0;
            *(int *)((long)pVVar1->m_data + 0xc) = uStack_1e0._4_4_;
            iVar24 = iVar24 + 1;
            uVar26 = this->m_gridSize;
            iVar10 = uVar26 + 1;
            iVar20 = iVar20 + 4;
          } while (iVar24 < iVar10);
        }
        iVar13 = iVar13 + 1;
        iVar11 = iVar11 + 4;
      } while (iVar13 < iVar10);
    }
    (**(code **)(lVar22 + 0x40))(0x8892,this->m_dataBufferID);
    (**(code **)(lVar22 + 0x150))
              (0x8892,(long)(local_1a8 - local_1b0._0_4_) & 0xfffffffffffffff0,local_1b0,0x88e4);
LAB_013bee6e:
    if (local_1b0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1b0,(long)local_1a0 - (long)local_1b0);
    }
  }
  else if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b0,
               (long)(this->m_gridSize * this->m_gridSize * 0xc),(allocator_type *)&local_23c);
    iVar11 = this->m_gridSize;
    if (0 < iVar11) {
      iVar13 = 0;
      do {
        if (0 < iVar11) {
          iVar10 = 0;
          do {
            auVar37._0_4_ = (float)iVar10;
            auVar38._4_8_ = 0;
            auVar38._0_4_ = auVar37._0_4_;
            auVar38._12_4_ = in_XMM3_Db;
            auVar37._8_8_ = auVar38._8_8_;
            auVar37._4_4_ = (float)iVar13;
            fVar43 = (float)iVar11;
            pBVar28 = (Bitfield<16UL> *)local_1e8;
            if ((iVar13 + iVar10 & 1U) == 0) {
              pBVar28 = &local_208;
            }
            auVar5._4_4_ = fVar43;
            auVar5._0_4_ = fVar43;
            auVar5._8_4_ = fVar43;
            auVar5._12_4_ = fVar43;
            auVar39 = divps(auVar37,auVar5);
            fVar36 = auVar39._0_4_ + auVar39._0_4_ + -1.0;
            fVar41 = auVar39._4_4_ + auVar39._4_4_ + -1.0;
            auVar6._8_4_ = 0;
            auVar6._0_8_ = CONCAT44(fVar41,fVar36);
            auVar6._12_4_ = 0x3f800000;
            *(undefined1 (*) [16])
             ((pointer)((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc) * 0x10))->m_data
                 = auVar6;
            iVar11 = (this->m_gridSize * iVar13 + iVar10) * 0xc + 2;
            *(float *)((long)((pointer)((long)local_1b0 + (long)iVar11 * 0x10))->m_data + 4) =
                 fVar41;
            *(undefined8 *)((long)((pointer)((long)local_1b0 + (long)iVar11 * 0x10))->m_data + 8) =
                 0x3f80000000000000;
            fVar42 = 2.0 / fVar43 + fVar36;
            fVar43 = 2.0 / fVar43 + fVar41;
            ((pointer)((long)local_1b0 + (long)iVar11 * 0x10))->m_data[0] = fVar42;
            pVVar1 = (pointer)((long)local_1b0 +
                              (long)((this->m_gridSize * iVar13 + iVar10) * 0xc + 4) * 0x10);
            pVVar1->m_data[0] = fVar42;
            *(float *)((long)pVVar1->m_data + 4) = fVar43;
            *(undefined4 *)((long)pVVar1->m_data + 8) = 0;
            *(undefined4 *)((long)pVVar1->m_data + 0xc) = 0x3f800000;
            auVar7._8_4_ = 0;
            auVar7._0_8_ = CONCAT44(fVar41,fVar36);
            auVar7._12_4_ = 0x3f800000;
            *(undefined1 (*) [16])
             ((pointer)
             ((long)local_1b0 + (long)((this->m_gridSize * iVar13 + iVar10) * 0xc + 6) * 0x10))->
             m_data = auVar7;
            pVVar1 = (pointer)((long)local_1b0 +
                              (long)((this->m_gridSize * iVar13 + iVar10) * 0xc + 8) * 0x10);
            pVVar1->m_data[0] = fVar42;
            *(float *)((long)pVVar1->m_data + 4) = fVar43;
            *(undefined4 *)((long)pVVar1->m_data + 8) = 0;
            *(undefined4 *)((long)pVVar1->m_data + 0xc) = 0x3f800000;
            iVar11 = (this->m_gridSize * iVar13 + iVar10) * 0xc + 10;
            ((pointer)((long)local_1b0 + (long)iVar11 * 0x10))->m_data[0] = fVar36;
            *(float *)((long)((pointer)((long)local_1b0 + (long)iVar11 * 0x10))->m_data + 4) =
                 fVar43;
            *(undefined8 *)((long)((pointer)((long)local_1b0 + (long)iVar11 * 0x10))->m_data + 8) =
                 0x3f80000000000000;
            iVar11 = this->m_gridSize;
            pBVar8 = pBVar28->m_begin;
            *(qpTestLog **)
             ((pointer)((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 1) * 0x10))->
             m_data = (qpTestLog *)pBVar28->m_value;
            *(BitDesc **)
             ((long)((pointer)
                    ((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 1) * 0x10))->m_data
             + 8) = pBVar8;
            iVar11 = this->m_gridSize;
            pBVar8 = pBVar28->m_begin;
            *(qpTestLog **)
             ((pointer)((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 3) * 0x10))->
             m_data = (qpTestLog *)pBVar28->m_value;
            *(BitDesc **)
             ((long)((pointer)
                    ((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 3) * 0x10))->m_data
             + 8) = pBVar8;
            iVar11 = this->m_gridSize;
            pBVar8 = pBVar28->m_begin;
            *(qpTestLog **)
             ((pointer)((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 5) * 0x10))->
             m_data = (qpTestLog *)pBVar28->m_value;
            *(BitDesc **)
             ((long)((pointer)
                    ((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 5) * 0x10))->m_data
             + 8) = pBVar8;
            iVar11 = this->m_gridSize;
            pBVar8 = pBVar28->m_begin;
            *(qpTestLog **)
             ((pointer)((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 7) * 0x10))->
             m_data = (qpTestLog *)pBVar28->m_value;
            *(BitDesc **)
             ((long)((pointer)
                    ((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 7) * 0x10))->m_data
             + 8) = pBVar8;
            iVar11 = this->m_gridSize;
            pBVar8 = pBVar28->m_begin;
            *(qpTestLog **)
             ((pointer)((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 9) * 0x10))->
             m_data = (qpTestLog *)pBVar28->m_value;
            *(BitDesc **)
             ((long)((pointer)
                    ((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 9) * 0x10))->m_data
             + 8) = pBVar8;
            iVar11 = this->m_gridSize;
            pBVar8 = pBVar28->m_begin;
            *(qpTestLog **)
             ((pointer)((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 0xb) * 0x10))->
             m_data = (qpTestLog *)pBVar28->m_value;
            *(BitDesc **)
             ((long)((pointer)
                    ((long)local_1b0 + (long)((iVar11 * iVar13 + iVar10) * 0xc + 0xb) * 0x10))->
                    m_data + 8) = pBVar8;
            iVar10 = iVar10 + 1;
            iVar11 = this->m_gridSize;
          } while (iVar10 < iVar11);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < iVar11);
    }
    (**(code **)(lVar22 + 0x40))(0x8892,this->m_dataBufferID);
    (**(code **)(lVar22 + 0x150))
              (0x8892,(long)(local_1a8 - local_1b0._0_4_) & 0xfffffffffffffff0,local_1b0,0x88e4);
    goto LAB_013bee6e;
  }
  dVar12 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar12,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x5b6);
LAB_013beeac:
  if ((this->m_computeIndices == false) && (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS)) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Uploading draw index buffer.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar22 = CONCAT44(extraout_var_02,iVar11);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,
               (long)(this->m_gridSize * this->m_gridSize * 6),(allocator_type *)&local_208);
    iVar11 = this->m_gridSize;
    if (0 < iVar11) {
      iVar13 = 0;
      iVar10 = 2;
      iVar24 = 0;
      do {
        if (0 < iVar11) {
          iVar27 = 0;
          iVar20 = 0;
          do {
            iVar29 = (iVar24 + iVar20) % 2;
            *(int *)((long)local_1e8 + (long)((iVar11 * iVar24 + iVar20) * 6) * 4) =
                 (iVar11 + 1) * iVar13 + iVar27 + iVar29;
            *(int *)((long)local_1e8 + (long)((this->m_gridSize * iVar24 + iVar20) * 6 + 1) * 4) =
                 (this->m_gridSize + 1) * iVar10 + iVar27 + iVar29;
            *(uint *)((long)local_1e8 + (long)((this->m_gridSize * iVar24 + iVar20) * 6 + 2) * 4) =
                 iVar27 + (this->m_gridSize + 1) * iVar10 + iVar29 + 2;
            *(int *)((long)local_1e8 + (long)((this->m_gridSize * iVar24 + iVar20) * 6 + 3) * 4) =
                 (this->m_gridSize + 1) * iVar13 + iVar27 + iVar29;
            *(uint *)((long)local_1e8 + (long)((this->m_gridSize * iVar24 + iVar20) * 6 + 4) * 4) =
                 (this->m_gridSize + 1) * iVar10 + iVar29 + iVar27 + 2;
            iVar11 = this->m_gridSize * iVar24 + iVar20;
            iVar20 = iVar20 + 1;
            *(uint *)((long)local_1e8 + (long)(iVar11 * 6 + 5) * 4) =
                 iVar27 + (this->m_gridSize + 1) * iVar13 + iVar29 + 2;
            iVar11 = this->m_gridSize;
            iVar27 = iVar27 + 2;
          } while (iVar20 < iVar11);
        }
        iVar24 = iVar24 + 1;
        iVar13 = iVar13 + 2;
        iVar10 = iVar10 + 2;
      } while (iVar24 < iVar11);
    }
    (**(code **)(lVar22 + 0x40))(0x8893,this->m_indexBufferID);
    (**(code **)(lVar22 + 0x150))
              (0x8893,(long)(int)((int)uStack_1e0 - local_1e8._0_4_) & 0xfffffffffffffffc,local_1e8,
               0x88e4);
    dVar12 = (**(code **)(lVar22 + 0x800))();
    glu::checkError(dVar12,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x5d1);
    if ((TextureFormat)local_1e8 != (TextureFormat)0x0) {
      operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
    }
  }
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Filling following buffers using compute shader:\n",0x30);
  pcVar25 = "\tcommand buffer\n";
  pcVar33 = glcts::fixed_sample_locations_values + 1;
  if (this->m_computeCmd == false) {
    pcVar25 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar25,(ulong)this->m_computeCmd << 4);
  pcVar25 = "\tdata buffer\n";
  bVar34 = this->m_computeData == false;
  if (bVar34) {
    pcVar25 = glcts::fixed_sample_locations_values + 1;
  }
  lVar22 = 0xd;
  if (bVar34) {
    lVar22 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar25,lVar22);
  bVar34 = this->m_computeIndices != false;
  if (bVar34) {
    pcVar33 = "\tindex buffer\n";
  }
  lVar22 = 0xe;
  if (!bVar34) {
    lVar22 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar33,lVar22);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  bVar34 = this->m_computeCmd;
  bVar3 = this->m_computeData;
  bVar4 = this->m_computeIndices;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Memory barrier. Barriers = ",0x1b);
  iVar11 = ((uint)bVar34 << 6 | (uint)bVar3) + (uint)bVar4 * 2;
  glu::getMemoryBarrierFlagsStr(&local_208,iVar11);
  local_1d8 = local_208.m_end;
  uStack_1e0 = (BitDesc *)CONCAT44(local_208.m_begin._4_4_,(ChannelOrder)local_208.m_begin);
  local_1e8 = (undefined1  [8])local_208.m_value;
  tcu::Format::Bitfield<16UL>::toStream((Bitfield<16UL> *)local_1e8,(ostream *)&local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  (**(code **)(local_1b8 + 0xdb8))(iVar11);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Drawing from buffers with ",0x1a);
  std::ostream::operator<<((ostringstream *)&local_1a8,this->m_numDrawCmds);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," draw call(s).",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar22 = CONCAT44(extraout_var_03,iVar11);
  uVar14 = (**(code **)(lVar22 + 0x780))((this->m_shaderProgram->m_program).m_program,"a_position");
  uVar15 = (**(code **)(lVar22 + 0x780))((this->m_shaderProgram->m_program).m_program,"a_color");
  local_23c = 0;
  (**(code **)(lVar22 + 0x708))(1);
  (**(code **)(lVar22 + 0xd8))(local_23c);
  (**(code **)(lVar22 + 0x40))(0x8892,this->m_dataBufferID);
  (**(code **)(lVar22 + 0x19f0))(uVar14,4,0x1406,0,0x20,0);
  (**(code **)(lVar22 + 0x19f0))(uVar15,4,0x1406,0,0x20,0x10);
  (**(code **)(lVar22 + 0x610))(uVar14);
  (**(code **)(lVar22 + 0x610))(uVar15);
  if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    (**(code **)(lVar22 + 0x40))(0x8893,this->m_indexBufferID);
  }
  (**(code **)(lVar22 + 0x40))(0x8f3f,this->m_cmdBufferID);
  (**(code **)(lVar22 + 0x1c0))(0,0,0);
  (**(code **)(lVar22 + 0x188))(0x4000);
  (**(code **)(lVar22 + 0x1a00))(0,0,local_220.m_width,local_220.m_height);
  (**(code **)(lVar22 + 0x1680))((this->m_shaderProgram->m_program).m_program);
  if (0 < this->m_numDrawCmds) {
    iVar11 = 0;
    do {
      if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
        (**(code **)(lVar22 + 0x540))(4,this->m_commandSize * iVar11);
      }
      else if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
        (**(code **)(lVar22 + 0x578))(4,0x1405);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < this->m_numDrawCmds);
  }
  (**(code **)(lVar22 + 0x1680))(0);
  (**(code **)(lVar22 + 0x490))(1,&local_23c);
  dVar12 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar12,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x605);
  (**(code **)(lVar22 + 0x648))();
  dVar12 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar12,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x608);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_208.m_value = 0x300000008;
  if ((void *)local_220.m_pixels.m_cap != (void *)0x0) {
    local_220.m_pixels.m_cap = (size_t)local_220.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1e8,(TextureFormat *)&local_208,local_220.m_width,
             local_220.m_height,1,(void *)local_220.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1e8);
  dVar12 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar12,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x60b);
  bVar34 = verifyImageYellowGreen
                     (&local_220,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pcVar25 = "Result image invalid";
  if (bVar34) {
    pcVar25 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar34,pcVar25);
  tcu::Surface::~Surface(&local_220);
  return STOP;
}

Assistant:

ComputeShaderGeneratedCase::IterateResult ComputeShaderGeneratedCase::iterate (void)
{
	const int				renderTargetWidth	= de::min(1024, m_context.getRenderTarget().getWidth());
	const int				renderTargetHeight	= de::min(1024, m_context.getRenderTarget().getHeight());
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	tcu::Surface			surface				(renderTargetWidth, renderTargetHeight);

	m_testCtx.getLog() << tcu::TestLog::Message << "Preparing to draw " << m_gridSize << " x " << m_gridSize << " grid." << tcu::TestLog::EndMessage;

	try
	{
		// Gen command buffer
		if (!m_computeCmd)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw command buffer." << tcu::TestLog::EndMessage;
			createDrawCommand();
		}

		// Gen data buffer
		if (!m_computeData)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw data buffer." << tcu::TestLog::EndMessage;
			createDrawData();
		}

		// Gen index buffer
		if (!m_computeIndices && m_drawMethod == DRAWMETHOD_DRAWELEMENTS)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw index buffer." << tcu::TestLog::EndMessage;
			createDrawIndices();
		}

		// Run compute shader
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Filling following buffers using compute shader:\n"
				<< ((m_computeCmd)		? ("\tcommand buffer\n")	: (""))
				<< ((m_computeData)		? ("\tdata buffer\n")		: (""))
				<< ((m_computeIndices)	? ("\tindex buffer\n")		: (""))
				<< tcu::TestLog::EndMessage;
			runComputeShader();
		}

		// Ensure data is written to the buffers before we try to read it
		{
			const glw::GLuint barriers = ((m_computeCmd)     ? (GL_COMMAND_BARRIER_BIT)             : (0)) |
										 ((m_computeData)    ? (GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT) : (0)) |
										 ((m_computeIndices) ? (GL_ELEMENT_ARRAY_BARRIER_BIT)       : (0));

			m_testCtx.getLog() << tcu::TestLog::Message << "Memory barrier. Barriers = " << glu::getMemoryBarrierFlagsStr(barriers) << tcu::TestLog::EndMessage;
			gl.memoryBarrier(barriers);
		}

		// Draw from buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing from buffers with " << m_numDrawCmds << " draw call(s)." << tcu::TestLog::EndMessage;
		renderTo(surface);
	}
	catch (glu::OutOfMemoryError&)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Got GL_OUT_OF_MEMORY." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Got GL_OUT_OF_MEMORY");
		m_testCtx.setTerminateAfter(true); // Do not rely on implementation to be able to recover from OOM
		return STOP;
	}


	// verify image
	// \note the green/yellow pattern is only for clarity. The test will only verify that all grid cells were drawn by looking for anything non-green/yellow.
	if (verifyImageYellowGreen(surface, m_testCtx.getLog()))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result image invalid");
	return STOP;
}